

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void __thiscall
bioparser::Parser<bioparser::test::SamOverlap>::~Parser(Parser<bioparser::test::SamOverlap> *this)

{
  pointer pcVar1;
  gzFile_s *pgVar2;
  
  this->_vptr_Parser = (_func_int **)&PTR__Parser_00158f08;
  pcVar1 = (this->storage_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
  }
  pgVar2 = (this->file_)._M_t.super___uniq_ptr_impl<gzFile_s,_int_(*)(gzFile_s_*)>._M_t.
           super__Tuple_impl<0UL,_gzFile_s_*,_int_(*)(gzFile_s_*)>.
           super__Head_base<0UL,_gzFile_s_*,_false>._M_head_impl;
  if (pgVar2 != (gzFile_s *)0x0) {
    (*(this->file_)._M_t.super___uniq_ptr_impl<gzFile_s,_int_(*)(gzFile_s_*)>._M_t.
      super__Tuple_impl<0UL,_gzFile_s_*,_int_(*)(gzFile_s_*)>.
      super__Tuple_impl<1UL,_int_(*)(gzFile_s_*)>.super__Head_base<1UL,_int_(*)(gzFile_s_*),_false>.
      _M_head_impl)(pgVar2);
  }
  (this->file_)._M_t.super___uniq_ptr_impl<gzFile_s,_int_(*)(gzFile_s_*)>._M_t.
  super__Tuple_impl<0UL,_gzFile_s_*,_int_(*)(gzFile_s_*)>.super__Head_base<0UL,_gzFile_s_*,_false>.
  _M_head_impl = (gzFile_s *)0x0;
  return;
}

Assistant:

virtual ~Parser() {}